

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O1

int Acb_NtkObjMffcEstimate(Acb_Ntk_t *pNtk,int iObj)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  
  if (iObj < 1) {
LAB_003a720d:
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                  ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
  }
  iVar1 = (pNtk->vObjFans).nSize;
  if (iVar1 <= iObj) {
LAB_003a722c:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  piVar3 = (pNtk->vObjFans).pArray;
  iVar5 = piVar3[(uint)iObj];
  lVar6 = (long)iVar5;
  if ((lVar6 < 0) || (iVar2 = (pNtk->vFanSto).nSize, iVar2 <= iVar5)) {
LAB_003a71ee:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  piVar4 = (pNtk->vFanSto).pArray;
  if ((long)piVar4[lVar6] < 1) {
    iVar5 = 0;
    uVar9 = 0xffffffff;
  }
  else {
    lVar7 = 0;
    uVar9 = 0xffffffff;
    iVar5 = 0;
    do {
      uVar8 = piVar4[lVar6 + lVar7 + 1];
      lVar10 = (long)(int)uVar8;
      if (lVar10 < 1) goto LAB_003a71b0;
      if ((pNtk->vObjType).nSize <= (int)uVar8) goto LAB_003a7191;
      bVar11 = true;
      if ((pNtk->vObjType).pArray[lVar10] != '\x03') {
        if ((pNtk->vFanouts).nSize <= (int)uVar8) goto LAB_003a71cf;
        bVar11 = (pNtk->vFanouts).pArray[lVar10].nSize != 1;
      }
      lVar7 = lVar7 + 1;
      iVar5 = iVar5 + (uint)(bVar11 ^ 1);
      if (bVar11 == false) {
        uVar9 = (ulong)uVar8;
      }
    } while (piVar4[lVar6] != lVar7);
  }
  if (iVar5 == 1) {
    if ((int)uVar9 < 1) goto LAB_003a720d;
    if (iVar1 <= (int)uVar9) goto LAB_003a722c;
    iVar1 = piVar3[uVar9];
    lVar6 = (long)iVar1;
    if ((lVar6 < 0) || (iVar2 <= iVar1)) goto LAB_003a71ee;
    if ((long)piVar4[lVar6] < 1) {
      iVar5 = 1;
    }
    else {
      iVar5 = 1;
      lVar7 = 0;
      do {
        iVar1 = piVar4[lVar6 + lVar7 + 1];
        lVar10 = (long)iVar1;
        if (lVar10 < 1) {
LAB_003a71b0:
          __assert_fail("i>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                        ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
        }
        if ((pNtk->vObjType).nSize <= iVar1) {
LAB_003a7191:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
        uVar8 = 0;
        if ((pNtk->vObjType).pArray[lVar10] != '\x03') {
          if ((pNtk->vFanouts).nSize <= iVar1) {
LAB_003a71cf:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                          ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          uVar8 = (uint)((pNtk->vFanouts).pArray[lVar10].nSize == 1);
        }
        iVar5 = iVar5 + uVar8;
        lVar7 = lVar7 + 1;
      } while (piVar4[lVar6] != lVar7);
    }
  }
  return iVar5;
}

Assistant:

static inline int Acb_NtkObjMffcEstimate( Acb_Ntk_t * pNtk, int iObj )
{
    int k, iFanin, * pFanins, Count = 0, iFaninCrit = -1;
    Acb_ObjForEachFaninFast( pNtk, iObj, pFanins, iFanin, k )
        if ( Acb_ObjIsAreaCritical(pNtk, iFanin) )
            iFaninCrit = iFanin, Count++;
    if ( Count != 1 )
        return Count;
    Acb_ObjForEachFaninFast( pNtk, iFaninCrit, pFanins, iFanin, k )
        if ( Acb_ObjIsAreaCritical(pNtk, iFanin) )
            Count++;
    return Count;
}